

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_SetRGB(GPU_Image *image,Uint8 r,Uint8 g,Uint8 b)

{
  SDL_Color local_17;
  SDL_Color c;
  Uint8 b_local;
  Uint8 g_local;
  Uint8 r_local;
  GPU_Image *image_local;
  
  local_17.g = g;
  local_17.r = r;
  local_17.b = b;
  local_17.a = 0xff;
  if (image != (GPU_Image *)0x0) {
    image->color = local_17;
  }
  return;
}

Assistant:

void GPU_SetRGB(GPU_Image* image, Uint8 r, Uint8 g, Uint8 b)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = 255;

    if(image == NULL)
        return;

    image->color = c;
}